

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_123::AllReader::copyInto(AllReader *this,ArrayPtr<unsigned_char> out)

{
  Array<unsigned_char> *pAVar1;
  long lVar2;
  Array<unsigned_char> *part;
  Array<unsigned_char> *pAVar3;
  ulong __n;
  
  pAVar1 = (this->parts).builder.pos;
  lVar2 = 0;
  for (pAVar3 = (this->parts).builder.ptr; pAVar3 != pAVar1; pAVar3 = pAVar3 + 1) {
    __n = out.size_ - lVar2;
    if (pAVar3->size_ < __n) {
      __n = pAVar3->size_;
    }
    memcpy(out.ptr + lVar2,pAVar3->ptr,__n);
    lVar2 = lVar2 + __n;
  }
  return;
}

Assistant:

void copyInto(ArrayPtr<byte> out) {
    size_t pos = 0;
    for (auto& part: parts) {
      size_t n = kj::min(part.size(), out.size() - pos);
      memcpy(out.begin() + pos, part.begin(), n);
      pos += n;
    }
  }